

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O2

value_type_conflict3 __thiscall
vigra::colormap<unsigned_short,_unsigned_short>::operator()
          (colormap<unsigned_short,_unsigned_short> *this,domain_type_conflict index,uint band)

{
  uint uVar1;
  undefined6 in_register_00000032;
  
  uVar1 = (uint)CONCAT62(in_register_00000032,index);
  throw_precondition_error
            (uVar1 < this->m_numTableElements,"index out of range",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx",
             0xed);
  if (this->m_numTables == 1) {
    throw_precondition_error
              (band < this->m_numTableBands,"band out of range",
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx"
               ,0xf1);
  }
  else {
    throw_precondition_error
              (band < this->m_numTables,"band out of range",
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx"
               ,0xf5);
    band = band * this->m_numTableBands;
  }
  return *(value_type_conflict3 *)
          ((long)(this->m_tables).super_void_vector_base.m_data +
          (ulong)(band * this->m_numTableElements + uVar1) * 2);
}

Assistant:

value_type operator()( const domain_type index,
                               const unsigned int band = 0 ) const
        {
            vigra_precondition( index < m_numTableElements,
                                "index out of range" );
            if ( m_numTables == 1 ) {
                // map bands with a single (interleaved or not) table
                vigra_precondition( band < m_numTableBands,
                                    "band out of range" );
                return m_tables[ m_numTableElements * band + index ];
            } else {
                // map bands with multiple, non-interleaved tables
                vigra_precondition( band < m_numTables, "band out of range" );
                const unsigned int stride
                    = m_numTableBands * m_numTableElements;
                return m_tables[ stride * band + index ];
            }
        }